

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

int __thiscall deqp::gls::LongStressCase::init(LongStressCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  _Rb_tree_header *p_Var2;
  ostringstream *poVar3;
  ostringstream *this_00;
  ostringstream *this_01;
  pointer pPVar4;
  long lVar5;
  pointer puVar6;
  iterator __position;
  TestLog *this_02;
  RenderContext *renderCtx;
  uint uVar7;
  int extraout_EAX;
  pointer pPVar8;
  pointer pPVar9;
  ulong uVar10;
  TextureLevel *this_03;
  SharedPtrStateBase *pSVar11;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *pGVar12;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *pGVar13;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGVar14;
  char *pcVar15;
  size_t sVar16;
  TestLog *pTVar17;
  TextureFormat this_04;
  TestLog *pTVar18;
  DebugInfoRenderer *this_05;
  TestError *this_06;
  int precision;
  int precision_00;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  bool bVar23;
  long lVar24;
  long *plVar25;
  long lVar26;
  SharedPtr<tcu::TextureLevel> dummyTex;
  ProgramSources sources;
  TextureFormat format;
  string local_2838;
  string local_2818;
  long *local_27f8;
  long local_27f0;
  long local_27e8 [2];
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  *local_27d8;
  vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *local_27d0;
  string local_27c8;
  string local_27a8;
  string local_2788;
  string local_2768;
  string local_2748;
  string local_2728;
  string local_2708;
  string local_26e8;
  string local_26c8;
  string local_26a8;
  string local_2688;
  string local_2668;
  string local_2648;
  string local_2628;
  string local_2608;
  string local_25e8;
  string local_25c8;
  undefined1 local_25a8 [8];
  SharedPtrStateBase *pSStack_25a0;
  ios_base local_2530 [72];
  bool local_24e8;
  undefined1 local_2428 [112];
  ios_base local_23b8 [8];
  ios_base local_23b0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2398;
  undefined1 local_2378 [208];
  undefined1 local_22a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2298 [6];
  ios_base local_2230 [264];
  undefined1 local_2128 [32];
  _Alloc_hider local_2108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20f8 [4];
  ios_base local_20b0 [264];
  undefined1 local_1fa8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f98 [6];
  ios_base local_1f30 [264];
  undefined1 local_1e28 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e18 [6];
  ios_base local_1db0 [264];
  LogSection local_1ca8;
  ios_base local_1c38 [264];
  undefined1 local_1b30 [16];
  TestLog local_1b20 [13];
  ios_base local_1ab8 [264];
  undefined1 local_19b0 [384];
  undefined1 local_1830 [384];
  undefined1 local_16b0 [384];
  undefined1 local_1530 [384];
  undefined1 local_13b0 [384];
  undefined1 local_1230 [384];
  undefined1 local_10b0 [384];
  undefined1 local_f30 [384];
  undefined1 local_db0 [384];
  undefined1 local_c30 [384];
  undefined1 local_ab0 [384];
  undefined1 local_930 [384];
  undefined1 local_7b0 [384];
  undefined1 local_630 [384];
  undefined1 local_4b0 [384];
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  local_27d8 = &this->m_programResources;
  std::
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ::resize(local_27d8,
           ((long)(this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_programContexts).
                  super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3);
  pPVar8 = (this->m_programContexts).
           super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_programContexts).
                              super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8) >> 3) *
          0x3cf3cf3d) {
    lVar19 = 0;
    do {
      lVar20 = *(long *)&pPVar8[lVar19].textureSpecs.
                         super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                         ._M_impl.super__Vector_impl_data;
      if (0 < (int)((ulong)((long)pPVar8[lVar19].textureSpecs.
                                  super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - lVar20) >> 4) *
              -0x33333333) {
        local_27d0 = &pPVar8[lVar19].textureSpecs;
        pPVar4 = (local_27d8->
                 super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar22 = 0;
        do {
          lVar24 = lVar22 * 0x50;
          local_2128._0_8_ =
               glu::mapGLTransferFormat
                         (*(deUint32 *)(lVar20 + 0x10 + lVar24),
                          *(deUint32 *)(lVar20 + 0x14 + lVar24));
          local_25a8 = (undefined1  [8])0x0;
          pSStack_25a0 = (SharedPtrStateBase *)0x0;
          pPVar9 = (this->m_programResources).
                   super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(this->m_programResources).
                                      super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9) >>
                       7)) {
            lVar26 = 0;
            do {
              lVar5 = *(long *)&pPVar9[lVar26].dummyTextures.
                                super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                ._M_impl;
              uVar10 = (ulong)((long)pPVar9[lVar26].dummyTextures.
                                     super__Vector_base<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - lVar5) >> 4;
              if (0 < (int)uVar10) {
                plVar25 = (long *)(lVar5 + 8);
                do {
                  if ((local_2128._0_4_ == (ChannelOrder)*(undefined8 *)plVar25[-1]) &&
                     (local_2128._4_4_ == (ChannelType)((ulong)*(undefined8 *)plVar25[-1] >> 0x20)))
                  {
                    if (pSStack_25a0 != (SharedPtrStateBase *)*plVar25) {
                      if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
                        LOCK();
                        pdVar1 = &pSStack_25a0->strongRefCount;
                        *pdVar1 = *pdVar1 + -1;
                        UNLOCK();
                        if (*pdVar1 == 0) {
                          local_25a8 = (undefined1  [8])0x0;
                          (*pSStack_25a0->_vptr_SharedPtrStateBase[2])();
                        }
                        LOCK();
                        pdVar1 = &pSStack_25a0->weakRefCount;
                        *pdVar1 = *pdVar1 + -1;
                        UNLOCK();
                        if ((*pdVar1 == 0) && (pSStack_25a0 != (SharedPtrStateBase *)0x0)) {
                          (*pSStack_25a0->_vptr_SharedPtrStateBase[1])();
                        }
                      }
                      local_25a8 = (undefined1  [8])plVar25[-1];
                      pSStack_25a0 = (SharedPtrStateBase *)*plVar25;
                      if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
                        LOCK();
                        pSStack_25a0->strongRefCount = pSStack_25a0->strongRefCount + 1;
                        UNLOCK();
                        LOCK();
                        pSStack_25a0->weakRefCount = pSStack_25a0->weakRefCount + 1;
                        UNLOCK();
                      }
                    }
                    break;
                  }
                  plVar25 = plVar25 + 2;
                  uVar7 = (int)uVar10 - 1;
                  uVar10 = (ulong)uVar7;
                } while (uVar7 != 0);
              }
              lVar26 = lVar26 + 1;
              pPVar9 = (this->m_programResources).
                       super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar26 < (int)((ulong)((long)(this->m_programResources).
                                                  super__Vector_base<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pPVar9) >> 7));
          }
          if (local_25a8 == (undefined1  [8])0x0) {
            this_03 = (TextureLevel *)operator_new(0x28);
            tcu::TextureLevel::TextureLevel(this_03,(TextureFormat *)local_2128);
            pSVar11 = (SharedPtrStateBase *)operator_new(0x20);
            pSVar11->strongRefCount = 0;
            pSVar11->weakRefCount = 0;
            pSVar11->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0079ab28;
            pSVar11[1]._vptr_SharedPtrStateBase = (_func_int **)this_03;
            pSVar11->strongRefCount = 1;
            pSVar11->weakRefCount = 1;
            if (pSStack_25a0 != pSVar11) {
              if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
                LOCK();
                pdVar1 = &pSStack_25a0->strongRefCount;
                *pdVar1 = *pdVar1 + -1;
                UNLOCK();
                if (*pdVar1 == 0) {
                  local_25a8 = (undefined1  [8])0x0;
                  (*pSStack_25a0->_vptr_SharedPtrStateBase[2])();
                }
                LOCK();
                pdVar1 = &pSStack_25a0->weakRefCount;
                *pdVar1 = *pdVar1 + -1;
                UNLOCK();
                if ((*pdVar1 == 0) && (pSStack_25a0 != (SharedPtrStateBase *)0x0)) {
                  (*pSStack_25a0->_vptr_SharedPtrStateBase[1])();
                }
              }
              LOCK();
              pSVar11->strongRefCount = pSVar11->strongRefCount + 1;
              UNLOCK();
              LOCK();
              pSVar11->weakRefCount = pSVar11->weakRefCount + 1;
              UNLOCK();
              local_25a8 = (undefined1  [8])this_03;
              pSStack_25a0 = pSVar11;
            }
            LOCK();
            pdVar1 = &pSVar11->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              (*pSVar11->_vptr_SharedPtrStateBase[2])(pSVar11);
            }
            LOCK();
            pdVar1 = &pSVar11->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              (*pSVar11->_vptr_SharedPtrStateBase[1])(pSVar11);
            }
          }
          lVar20 = lVar20 + lVar24;
          if ((((IVec3 *)((long)local_25a8 + 8))->m_data[0] < *(int *)(lVar20 + 8)) ||
             (((IVec3 *)((long)local_25a8 + 8))->m_data[1] < *(int *)(lVar20 + 0xc))) {
            tcu::TextureLevel::setSize
                      ((TextureLevel *)local_25a8,*(int *)(lVar20 + 8),*(int *)(lVar20 + 0xc),1);
            tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2428,(TextureLevel *)local_25a8)
            ;
            tcu::fillWithComponentGradients
                      ((PixelBufferAccess *)local_2428,(Vec4 *)(lVar20 + 0x30),
                       (Vec4 *)(lVar20 + 0x40));
          }
          std::
          vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
          ::push_back(&pPVar4[lVar19].dummyTextures,(value_type *)local_25a8);
          if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSStack_25a0->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              local_25a8 = (undefined1  [8])0x0;
              (*pSStack_25a0->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &pSStack_25a0->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              if (pSStack_25a0 != (SharedPtrStateBase *)0x0) {
                (*pSStack_25a0->_vptr_SharedPtrStateBase[1])();
              }
              pSStack_25a0 = (SharedPtrStateBase *)0x0;
            }
          }
          lVar22 = lVar22 + 1;
          lVar20 = *(long *)&(local_27d0->
                             super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                             )._M_impl.super__Vector_impl_data;
        } while (lVar22 < (int)((ulong)((long)(local_27d0->
                                              super__Vector_base<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>
                                              )._M_impl.super__Vector_impl_data._M_finish - lVar20)
                               >> 4) * -0x33333333);
      }
      lVar19 = lVar19 + 1;
      pPVar8 = (this->m_programContexts).
               super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar19 < (int)((ulong)((long)(this->m_programContexts).
                                          super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8)
                           >> 3) * 0x3cf3cf3d);
  }
  puVar6 = (this->m_vertexIndices).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar6) {
    (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar6;
  }
  if (0 < this->m_numVerticesPerDrawCall) {
    iVar21 = 0;
    do {
      local_2428._0_2_ = (unsigned_short)iVar21;
      __position._M_current =
           (this->m_vertexIndices).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vertexIndices).
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&this->m_vertexIndices,__position,(unsigned_short *)local_2428);
      }
      else {
        *__position._M_current = (unsigned_short)iVar21;
        (this->m_vertexIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 < this->m_numVerticesPerDrawCall);
  }
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
            (&this->m_rnd,
             (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )(this->m_vertexIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )(this->m_vertexIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish);
  pGVar12 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *)operator_new(0x48);
  p_Var2 = &(pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header;
  (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pGVar12->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pGVar12->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar12->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar12->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Program>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_programs = pGVar12;
  pGVar13 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *)operator_new(0x48);
  p_Var2 = &(pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pGVar13->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pGVar13->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar13->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar13->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_buffers = pGVar13;
  pGVar14 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *)operator_new(0x48);
  p_Var2 = &(pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pGVar14->m_objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pGVar14->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pGVar14->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pGVar14->m_garbageObjects).
  super__Vector_base<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>,_std::allocator<de::SharedPtr<deqp::gls::LongStressCaseInternal::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_textures = pGVar14;
  this->m_currentIteration = 0;
  this_02 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_930 + 8);
  local_930._0_8_ = this_02;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Number of iterations: ",0x16);
  if (this->m_numIterations < 1) {
    local_27f8 = local_27e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_27f8,"infinite","");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1ca8);
    std::ostream::operator<<(&local_1ca8,this->m_numIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1ca8);
    std::ios_base::~ios_base(local_1c38);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,(char *)local_27f8,local_27f0);
  local_7b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_930,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar3 = (ostringstream *)(local_7b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Number of draw calls per iteration: ",0x24);
  std::ostream::operator<<(poVar3,this->m_numDrawCallsPerIteration);
  local_630._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_7b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar3 = (ostringstream *)(local_630 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Number of triangles per draw call: ",0x23);
  std::ostream::operator<<(poVar3,this->m_numTrianglesPerDrawCall);
  local_4b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_4b0 + 8),"Using triangle strips",0x15);
  local_330._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar3 = (ostringstream *)(local_330 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Approximate texture memory usage limit: ",0x28);
  de::floatToString_abi_cxx11_
            (&local_25c8,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,precision);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,local_25c8._M_dataplus._M_p,local_25c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," MiB",4);
  local_1b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Approximate buffer memory usage limit: ",0x27);
  de::floatToString_abi_cxx11_
            (&local_25e8,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07,precision_00
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,local_25e8._M_dataplus._M_p,local_25e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," MiB",4);
  local_19b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_19b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_19b0 + 8),"Default vertex attribute data buffer usage parameter: ",
             0x36);
  pcVar15 = glu::getUsageName(this->m_attrBufferUsage);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)local_19b0 + 8 + (int)*(undefined8 *)(local_19b0._8_8_ + -0x18));
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_19b0 + 8),pcVar15,sVar16);
  }
  local_1830._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_19b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1830 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1830 + 8),"Default vertex index data buffer usage parameter: ",0x32);
  pcVar15 = glu::getUsageName(this->m_indexBufferUsage);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)local_1830 + 8 + (int)*(undefined8 *)(local_1830._8_8_ + -0x18));
  }
  else {
    sVar16 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1830 + 8),pcVar15,sVar16);
  }
  pTVar17 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1830,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_2818._M_dataplus._M_p = (pointer)&local_2818.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2818,"ProbabilityParams","");
  local_2838._M_dataplus._M_p = (pointer)&local_2838.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2838,"Per-iteration probability parameters","");
  tcu::LogSection::LogSection(&local_1ca8,&local_2818,&local_2838);
  tcu::TestLog::startSection
            (pTVar17,local_1ca8.m_name._M_dataplus._M_p,local_1ca8.m_description._M_dataplus._M_p);
  local_16b0._0_8_ = pTVar17;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_16b0 + 8));
  pcVar15 = "Program re-build: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_16b0 + 8),"Program re-build: ",0x12);
  probabilityStr_abi_cxx11_(&local_2608,(gls *)pcVar15,(this->m_probabilities).rebuildProgram);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_16b0 + 8),local_2608._M_dataplus._M_p,local_2608._M_string_length);
  local_1530._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_16b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1530 + 8));
  pcVar15 = "Texture re-upload: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1530 + 8),"Texture re-upload: ",0x13);
  probabilityStr_abi_cxx11_(&local_2628,(gls *)pcVar15,(this->m_probabilities).reuploadTexture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1530 + 8),local_2628._M_dataplus._M_p,local_2628._M_string_length);
  local_13b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1530,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_13b0 + 8));
  pcVar15 = "Buffer re-upload: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_13b0 + 8),"Buffer re-upload: ",0x12);
  probabilityStr_abi_cxx11_(&local_2648,(gls *)pcVar15,(this->m_probabilities).reuploadBuffer);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_13b0 + 8),local_2648._M_dataplus._M_p,local_2648._M_string_length);
  local_1230._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_13b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
  pcVar15 = "Use glTexImage* instead of glTexSubImage* when uploading texture: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1230 + 8),
             "Use glTexImage* instead of glTexSubImage* when uploading texture: ",0x42);
  probabilityStr_abi_cxx11_(&local_2668,(gls *)pcVar15,(this->m_probabilities).reuploadWithTexImage)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1230 + 8),local_2668._M_dataplus._M_p,local_2668._M_string_length);
  local_10b0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1230,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_10b0 + 8));
  pcVar15 = "Use glBufferData* instead of glBufferSubData* when uploading buffer: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_10b0 + 8),
             "Use glBufferData* instead of glBufferSubData* when uploading buffer: ",0x45);
  probabilityStr_abi_cxx11_
            (&local_2688,(gls *)pcVar15,(this->m_probabilities).reuploadWithBufferData);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_10b0 + 8),local_2688._M_dataplus._M_p,local_2688._M_string_length);
  local_f30._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_10b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_f30 + 8));
  pcVar15 = "Delete texture after using it, even if could re-use it: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_f30 + 8),"Delete texture after using it, even if could re-use it: ",
             0x38);
  probabilityStr_abi_cxx11_(&local_26a8,(gls *)pcVar15,(this->m_probabilities).deleteTexture);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_f30 + 8),local_26a8._M_dataplus._M_p,local_26a8._M_string_length);
  local_db0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_f30,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_db0 + 8));
  pcVar15 = "Delete buffer after using it, even if could re-use it: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_db0 + 8),"Delete buffer after using it, even if could re-use it: ",
             0x37);
  probabilityStr_abi_cxx11_(&local_26c8,(gls *)pcVar15,(this->m_probabilities).deleteBuffer);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_db0 + 8),local_26c8._M_dataplus._M_p,local_26c8._M_string_length);
  local_c30._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_db0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_c30 + 8));
  pcVar15 = "Don\'t re-use texture, and only delete if memory limit is hit: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_c30 + 8),
             "Don\'t re-use texture, and only delete if memory limit is hit: ",0x3e);
  probabilityStr_abi_cxx11_
            (&local_26e8,(gls *)pcVar15,(this->m_probabilities).wastefulTextureMemoryUsage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_c30 + 8),local_26e8._M_dataplus._M_p,local_26e8._M_string_length);
  local_ab0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_c30,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_ab0 + 8));
  pcVar15 = "Don\'t re-use buffer, and only delete if memory limit is hit: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_ab0 + 8),
             "Don\'t re-use buffer, and only delete if memory limit is hit: ",0x3d);
  probabilityStr_abi_cxx11_
            (&local_2708,(gls *)pcVar15,(this->m_probabilities).wastefulBufferMemoryUsage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_ab0 + 8),local_2708._M_dataplus._M_p,local_2708._M_string_length);
  local_1b30._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_ab0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b30 + 8));
  pcVar15 = "Use client memory (instead of GL buffers) for vertex attribute data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b30 + 8),
             "Use client memory (instead of GL buffers) for vertex attribute data: ",0x45);
  probabilityStr_abi_cxx11_
            (&local_2728,(gls *)pcVar15,(this->m_probabilities).clientMemoryAttributeData);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b30 + 8),local_2728._M_dataplus._M_p,local_2728._M_string_length);
  local_22a8._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1b30,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_22a8 + 8));
  pcVar15 = "Use client memory (instead of GL buffers) for vertex index data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_22a8 + 8),
             "Use client memory (instead of GL buffers) for vertex index data: ",0x41);
  probabilityStr_abi_cxx11_
            (&local_2748,(gls *)pcVar15,(this->m_probabilities).clientMemoryIndexData);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_22a8 + 8),local_2748._M_dataplus._M_p,local_2748._M_string_length);
  local_1e28._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_22a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1e28 + 8));
  pcVar15 = "Use random target parameter when uploading buffer data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1e28 + 8),"Use random target parameter when uploading buffer data: ",
             0x38);
  probabilityStr_abi_cxx11_
            (&local_2768,(gls *)pcVar15,(this->m_probabilities).randomBufferUploadTarget);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1e28 + 8),local_2768._M_dataplus._M_p,local_2768._M_string_length);
  local_1fa8._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1e28,(EndMessageToken *)&tcu::TestLog::EndMessage);
  poVar3 = (ostringstream *)(local_1fa8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  pcVar15 = "Use random usage parameter when uploading buffer data: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Use random usage parameter when uploading buffer data: ",0x37);
  probabilityStr_abi_cxx11_(&local_2788,(gls *)pcVar15,(this->m_probabilities).randomBufferUsage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,local_2788._M_dataplus._M_p,local_2788._M_string_length);
  local_2128._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1fa8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = (ostringstream *)(local_2128 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  pcVar15 = "Use glDrawArrays instead of glDrawElements: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Use glDrawArrays instead of glDrawElements: ",0x2c);
  probabilityStr_abi_cxx11_(&local_27a8,(gls *)pcVar15,(this->m_probabilities).useDrawArrays);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_27a8._M_dataplus._M_p,local_27a8._M_string_length);
  local_25a8 = (undefined1  [8])
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_2128,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_25a0);
  pcVar15 = "Use separate buffers for each attribute, instead of one array for all: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_25a0,
             "Use separate buffers for each attribute, instead of one array for all: ",0x47);
  probabilityStr_abi_cxx11_
            (&local_27c8,(gls *)pcVar15,(this->m_probabilities).separateAttributeBuffers);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_25a0,local_27c8._M_dataplus._M_p,local_27c8._M_string_length);
  this_04 = (TextureFormat)
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_25a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection((TestLog *)this_04);
  this_01 = (ostringstream *)(local_2428 + 8);
  local_2428._0_8_ = this_04;
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Using ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," program(s)",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2428,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_23b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27c8._M_dataplus._M_p != &local_27c8.field_2) {
    operator_delete(local_27c8._M_dataplus._M_p,local_27c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_25a0);
  std::ios_base::~ios_base(local_2530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27a8._M_dataplus._M_p != &local_27a8.field_2) {
    operator_delete(local_27a8._M_dataplus._M_p,local_27a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_20b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2788._M_dataplus._M_p != &local_2788.field_2) {
    operator_delete(local_2788._M_dataplus._M_p,local_2788.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_1f30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2768._M_dataplus._M_p != &local_2768.field_2) {
    operator_delete(local_2768._M_dataplus._M_p,local_2768.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1e28 + 8));
  std::ios_base::~ios_base(local_1db0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2748._M_dataplus._M_p != &local_2748.field_2) {
    operator_delete(local_2748._M_dataplus._M_p,local_2748.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_22a8 + 8));
  std::ios_base::~ios_base(local_2230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2728._M_dataplus._M_p != &local_2728.field_2) {
    operator_delete(local_2728._M_dataplus._M_p,local_2728.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b30 + 8));
  std::ios_base::~ios_base(local_1ab8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2708._M_dataplus._M_p != &local_2708.field_2) {
    operator_delete(local_2708._M_dataplus._M_p,local_2708.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_ab0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_ab0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26e8._M_dataplus._M_p != &local_26e8.field_2) {
    operator_delete(local_26e8._M_dataplus._M_p,local_26e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_c30 + 8));
  std::ios_base::~ios_base((ios_base *)(local_c30 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26c8._M_dataplus._M_p != &local_26c8.field_2) {
    operator_delete(local_26c8._M_dataplus._M_p,local_26c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_db0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_db0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_26a8._M_dataplus._M_p != &local_26a8.field_2) {
    operator_delete(local_26a8._M_dataplus._M_p,local_26a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_f30 + 8));
  std::ios_base::~ios_base((ios_base *)(local_f30 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2688._M_dataplus._M_p != &local_2688.field_2) {
    operator_delete(local_2688._M_dataplus._M_p,local_2688.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_10b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_10b0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2668._M_dataplus._M_p != &local_2668.field_2) {
    operator_delete(local_2668._M_dataplus._M_p,local_2668.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1230 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1230 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2648._M_dataplus._M_p != &local_2648.field_2) {
    operator_delete(local_2648._M_dataplus._M_p,local_2648.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_13b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_13b0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2628._M_dataplus._M_p != &local_2628.field_2) {
    operator_delete(local_2628._M_dataplus._M_p,local_2628.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1530 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1530 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2608._M_dataplus._M_p != &local_2608.field_2) {
    operator_delete(local_2608._M_dataplus._M_p,local_2608.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_16b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_16b0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ca8.m_description._M_dataplus._M_p != &local_1ca8.m_description.field_2) {
    operator_delete(local_1ca8.m_description._M_dataplus._M_p,
                    local_1ca8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ca8.m_name._M_dataplus._M_p != &local_1ca8.m_name.field_2) {
    operator_delete(local_1ca8.m_name._M_dataplus._M_p,
                    local_1ca8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2838._M_dataplus._M_p != &local_2838.field_2) {
    operator_delete(local_2838._M_dataplus._M_p,local_2838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2818._M_dataplus._M_p != &local_2818.field_2) {
    operator_delete(local_2818._M_dataplus._M_p,local_2818.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1830 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1830 + 0x78));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_19b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_19b0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25e8._M_dataplus._M_p != &local_25e8.field_2) {
    operator_delete(local_25e8._M_dataplus._M_p,local_25e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25c8._M_dataplus._M_p != &local_25c8.field_2) {
    operator_delete(local_25c8._M_dataplus._M_p,local_25c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_330 + 8));
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x78));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x78));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_630 + 8));
  std::ios_base::~ios_base((ios_base *)(local_630 + 0x78));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_7b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_7b0 + 0x78));
  if (local_27f8 != local_27e8) {
    operator_delete(local_27f8,local_27e8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_930 + 8));
  std::ios_base::~ios_base((ios_base *)(local_930 + 0x78));
  pPVar8 = (this->m_programContexts).
           super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar21 = (int)((ulong)((long)(this->m_programContexts).
                               super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8) >> 3) *
           0x3cf3cf3d;
  if (0 < iVar21) {
    lVar19 = 0;
    bVar23 = false;
    do {
      local_1fa8._0_8_ = local_1fa8 + 0x10;
      renderCtx = this->m_renderCtx;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1fa8,"");
      mangleShaderNames((string *)local_2128,&pPVar8[lVar19].vertexSource,(string *)local_1fa8);
      local_22a8._0_8_ = local_22a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_22a8,"");
      mangleShaderNames((string *)local_1e28,&pPVar8[lVar19].fragmentSource,(string *)local_22a8);
      local_2378[0x10] = 0;
      local_2378._17_8_ = 0;
      local_2378._0_8_ = (pointer)0x0;
      local_2378[8] = 0;
      local_2378._9_7_ = 0;
      memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2428,0,0xac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2428,(value_type *)local_2128);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2428 + 0x18),(value_type *)local_1e28);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_25a8,renderCtx,(ProgramSources *)local_2428);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2378);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_2398);
      lVar20 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2428 + lVar20));
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != -0x18);
      if ((TestLog *)local_1e28._0_8_ != (TestLog *)(local_1e28 + 0x10)) {
        operator_delete((void *)local_1e28._0_8_,local_1e18[0]._M_allocated_capacity + 1);
      }
      pTVar17 = (TestLog *)(local_1fa8 + 0x10);
      if ((TestLog *)local_22a8._0_8_ != (TestLog *)(local_22a8 + 0x10)) {
        operator_delete((void *)local_22a8._0_8_,(ulong)(local_2298[0]._M_allocated_capacity + 1));
      }
      if (local_2128._0_8_ != (long)local_2128 + 0x10) {
        operator_delete((void *)local_2128._0_8_,local_2128._16_8_ + 1);
      }
      if ((TestLog *)local_1fa8._0_8_ != pTVar17) {
        operator_delete((void *)local_1fa8._0_8_,(ulong)(local_1f98[0]._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2428);
      std::ostream::operator<<((ostringstream *)local_2428,(int)lVar19);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2428);
      std::ios_base::~ios_base(local_23b8);
      plVar25 = (long *)std::__cxx11::string::replace((ulong)local_1e28,0,(char *)0x0,0x698a6c);
      pTVar18 = (TestLog *)(plVar25 + 2);
      if ((TestLog *)*plVar25 == pTVar18) {
        local_1f98[0]._0_8_ = pTVar18->m_log;
        local_1f98[0]._8_8_ = plVar25[3];
        local_1fa8._0_8_ = pTVar17;
      }
      else {
        local_1f98[0]._0_8_ = pTVar18->m_log;
        local_1fa8._0_8_ = (TestLog *)*plVar25;
      }
      local_1fa8._8_8_ = plVar25[1];
      *plVar25 = (long)pTVar18;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2428);
      std::ostream::operator<<((ostringstream *)local_2428,(int)lVar19);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2428);
      std::ios_base::~ios_base(local_23b8);
      plVar25 = (long *)std::__cxx11::string::replace((ulong)local_1b30,0,(char *)0x0,0x67ea52);
      pTVar18 = (TestLog *)(plVar25 + 2);
      if ((TestLog *)*plVar25 == pTVar18) {
        local_2298[0]._0_8_ = pTVar18->m_log;
        local_2298[0]._8_8_ = plVar25[3];
        local_22a8._0_8_ = (TestLog *)(local_22a8 + 0x10);
      }
      else {
        local_2298[0]._0_8_ = pTVar18->m_log;
        local_22a8._0_8_ = (TestLog *)*plVar25;
      }
      local_22a8._8_8_ = plVar25[1];
      *plVar25 = (long)pTVar18;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      tcu::LogSection::LogSection
                ((LogSection *)local_2128,(string *)local_1fa8,(string *)local_22a8);
      tcu::TestLog::startSection(this_02,(char *)local_2128._0_8_,local_2108._M_p);
      pTVar18 = glu::operator<<(this_02,(ShaderProgram *)local_25a8);
      tcu::TestLog::endSection(pTVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2108._M_p != local_20f8) {
        operator_delete(local_2108._M_p,local_20f8[0]._M_allocated_capacity + 1);
      }
      if (local_2128._0_8_ != (long)local_2128 + 0x10) {
        operator_delete((void *)local_2128._0_8_,local_2128._16_8_ + 1);
      }
      if ((TestLog *)local_22a8._0_8_ != (TestLog *)(local_22a8 + 0x10)) {
        operator_delete((void *)local_22a8._0_8_,(ulong)(local_2298[0]._M_allocated_capacity + 1));
      }
      if ((TestLog *)local_1b30._0_8_ != local_1b20) {
        operator_delete((void *)local_1b30._0_8_,(ulong)((long)&(local_1b20[0].m_log)->flags + 1));
      }
      if ((TestLog *)local_1fa8._0_8_ != pTVar17) {
        operator_delete((void *)local_1fa8._0_8_,(ulong)(local_1f98[0]._M_allocated_capacity + 1));
      }
      if ((TestLog *)local_1e28._0_8_ != (TestLog *)(local_1e28 + 0x10)) {
        operator_delete((void *)local_1e28._0_8_,local_1e18[0]._M_allocated_capacity + 1);
      }
      if (local_24e8 == false) {
        bVar23 = true;
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_25a8);
      lVar19 = lVar19 + 1;
      pPVar8 = (this->m_programContexts).
               super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar21 = (int)((ulong)((long)(this->m_programContexts).
                                   super__Vector_base<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8) >> 3)
               * 0x3cf3cf3d;
    } while (lVar19 < iVar21);
    if (bVar23) {
      this_06 = (TestError *)__cxa_allocate_exception(0x38);
      local_2428._0_8_ = (long)local_2428 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2428,"One or more shader programs failed to compile","");
      tcu::TestError::TestError(this_06,(string *)local_2428);
      __cxa_throw(this_06,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_showDebugInfo == true) {
    this_05 = (DebugInfoRenderer *)operator_new(0x40);
    LongStressCaseInternal::DebugInfoRenderer::DebugInfoRenderer(this_05,this->m_renderCtx);
    this->m_debugInfoRenderer = this_05;
    iVar21 = extraout_EAX;
  }
  return iVar21;
}

Assistant:

void LongStressCase::init (void)
{
	// Generate dummy texture data for each texture spec in m_programContexts.

	DE_ASSERT(!m_programContexts.empty());
	DE_ASSERT(m_programResources.empty());
	m_programResources.resize(m_programContexts.size());

	for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
	{
		const ProgramContext&	progCtx = m_programContexts[progCtxNdx];
		ProgramResources&		progRes = m_programResources[progCtxNdx];

		for (int texSpecNdx = 0; texSpecNdx < (int)progCtx.textureSpecs.size(); texSpecNdx++)
		{
			const TextureSpec&		spec	= progCtx.textureSpecs[texSpecNdx];
			const TextureFormat		format	= glu::mapGLTransferFormat(spec.format, spec.dataType);

			// If texture data with the same format has already been generated, re-use that (don't care much about contents).

			SharedPtr<TextureLevel> dummyTex;

			for (int prevProgCtxNdx = 0; prevProgCtxNdx < (int)m_programResources.size(); prevProgCtxNdx++)
			{
				const vector<SharedPtr<TextureLevel> >& prevProgCtxTextures = m_programResources[prevProgCtxNdx].dummyTextures;

				for (int texNdx = 0; texNdx < (int)prevProgCtxTextures.size(); texNdx++)
				{
					if (prevProgCtxTextures[texNdx]->getFormat() == format)
					{
						dummyTex = prevProgCtxTextures[texNdx];
						break;
					}
				}
			}

			if (!dummyTex)
				dummyTex = SharedPtr<TextureLevel>(new TextureLevel(format));

			if (dummyTex->getWidth() < spec.width || dummyTex->getHeight() < spec.height)
			{
				dummyTex->setSize(spec.width, spec.height);
				tcu::fillWithComponentGradients(dummyTex->getAccess(), spec.minValue, spec.maxValue);
			}

			progRes.dummyTextures.push_back(dummyTex);
		}
	}

	m_vertexIndices.clear();
	for (int i = 0; i < m_numVerticesPerDrawCall; i++)
		m_vertexIndices.push_back((deUint16)i);
	m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

	DE_ASSERT(!m_programs && !m_buffers && !m_textures);
	m_programs = new GLObjectManager<Program>;
	m_buffers = new GLObjectManager<Buffer>;
	m_textures = new GLObjectManager<Texture>;

	m_currentIteration = 0;

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Number of iterations: "										<< (m_numIterations > 0 ? toString(m_numIterations) : "infinite")				<< TestLog::EndMessage
			<< TestLog::Message << "Number of draw calls per iteration: "						<< m_numDrawCallsPerIteration													<< TestLog::EndMessage
			<< TestLog::Message << "Number of triangles per draw call: "						<< m_numTrianglesPerDrawCall													<< TestLog::EndMessage
			<< TestLog::Message << "Using triangle strips"																														<< TestLog::EndMessage
			<< TestLog::Message << "Approximate texture memory usage limit: "					<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Approximate buffer memory usage limit: "					<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex attribute data buffer usage parameter: "		<< glu::getUsageName(m_attrBufferUsage)											<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex index data buffer usage parameter: "			<< glu::getUsageName(m_indexBufferUsage)										<< TestLog::EndMessage

			<< TestLog::Section("ProbabilityParams", "Per-iteration probability parameters")
			<< TestLog::Message << "Program re-build: "															<< probabilityStr(m_probabilities.rebuildProgram)				<< TestLog::EndMessage
			<< TestLog::Message << "Texture re-upload: "														<< probabilityStr(m_probabilities.reuploadTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Buffer re-upload: "															<< probabilityStr(m_probabilities.reuploadBuffer)				<< TestLog::EndMessage
			<< TestLog::Message << "Use glTexImage* instead of glTexSubImage* when uploading texture: "			<< probabilityStr(m_probabilities.reuploadWithTexImage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glBufferData* instead of glBufferSubData* when uploading buffer: "		<< probabilityStr(m_probabilities.reuploadWithBufferData)		<< TestLog::EndMessage
			<< TestLog::Message << "Delete texture after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Delete buffer after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteBuffer)					<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use texture, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulTextureMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use buffer, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulBufferMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex attribute data: "		<< probabilityStr(m_probabilities.clientMemoryAttributeData)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex index data: "			<< probabilityStr(m_probabilities.clientMemoryIndexData)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random target parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUploadTarget)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random usage parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUsage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glDrawArrays instead of glDrawElements: "								<< probabilityStr(m_probabilities.useDrawArrays)				<< TestLog::EndMessage
			<< TestLog::Message << "Use separate buffers for each attribute, instead of one array for all: "	<< probabilityStr(m_probabilities.separateAttributeBuffers)		<< TestLog::EndMessage
			<< TestLog::EndSection
			<< TestLog::Message << "Using " << m_programContexts.size() << " program(s)" << TestLog::EndMessage;

		bool anyProgramsFailed = false;
		for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
		{
			const ProgramContext& progCtx = m_programContexts[progCtxNdx];
			glu::ShaderProgram prog(m_renderCtx, glu::makeVtxFragSources(mangleShaderNames(progCtx.vertexSource, ""), mangleShaderNames(progCtx.fragmentSource, "")));
			log << TestLog::Section("ShaderProgram" + toString(progCtxNdx), "Shader program " + toString(progCtxNdx)) << prog << TestLog::EndSection;
			if (!prog.isOk())
				anyProgramsFailed = true;
		}

		if (anyProgramsFailed)
			throw tcu::TestError("One or more shader programs failed to compile");
	}

	DE_ASSERT(!m_debugInfoRenderer);
	if (m_showDebugInfo)
		m_debugInfoRenderer = new DebugInfoRenderer(m_renderCtx);
}